

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O0

void slang::ast::ClockVarSymbol::fromSyntax
               (Scope *scope,ClockingItemSyntax *syntax,
               SmallVectorBase<const_slang::ast::ClockVarSymbol_*> *results)

{
  SourceRange sourceRange;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  bool bVar1;
  int iVar2;
  Symbol *this;
  ClockingDirectionSyntax *pCVar3;
  SourceLocation SVar4;
  ClockVarSymbol *this_00;
  undefined4 extraout_var;
  DeclaredType *this_01;
  Type *newType;
  long in_RSI;
  Scope *in_RDI;
  LookupLocation LVar5;
  ClockingSkew CVar6;
  string_view sVar7;
  Scope *in_stack_00000058;
  bitmask<slang::ast::LookupFlags> in_stack_00000064;
  undefined1 in_stack_00000068 [16];
  undefined1 in_stack_00000078 [16];
  undefined1 in_stack_000000a0 [16];
  Expression *valExpr;
  DeclaredType *sourceType;
  bool in_stack_000000f6;
  bool in_stack_000000f7;
  HierarchicalReference *in_stack_000000f8;
  Diagnostic *diag;
  ASTContext *in_stack_00000108;
  SourceRange in_stack_00000110;
  Symbol *sym;
  Expression *expr;
  ClockVarSymbol *arg;
  Token name;
  AttributeSpecSyntax *decl;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *__range2;
  ClockingSkew outputSkew;
  ClockingSkew inputSkew;
  ArgumentDirection dir;
  ASTContext context;
  LookupLocation ll;
  Scope *parent;
  Compilation *comp;
  SourceLocation in_stack_fffffffffffffd08;
  SourceLocation in_stack_fffffffffffffd10;
  SourceLocation in_stack_fffffffffffffd18;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffd20;
  Scope *in_stack_fffffffffffffd28;
  SourceLocation in_stack_fffffffffffffd30;
  SourceLocation in_stack_fffffffffffffd38;
  ValueSymbol *in_stack_fffffffffffffd40;
  Scope *in_stack_fffffffffffffd48;
  undefined7 in_stack_fffffffffffffd50;
  bitmask<slang::ast::AssignFlags> in_stack_fffffffffffffd57;
  ExpressionSyntax *in_stack_fffffffffffffd58;
  ClockVarSymbol *in_stack_fffffffffffffd60;
  Compilation *args_4;
  ClockVarSymbol *in_stack_fffffffffffffd70;
  Scope *in_stack_fffffffffffffd78;
  Scope *args_1;
  not_null<slang::ast::DeclaredType_*> in_stack_fffffffffffffd88;
  ClockingSkewSyntax *in_stack_fffffffffffffd90;
  SourceRange local_258;
  Scope *local_248;
  DeclaredType *local_240;
  DeclaredType *local_238;
  undefined8 local_230;
  undefined4 local_224;
  string_view local_220;
  SourceRange local_210;
  undefined4 local_1fc;
  ValueSymbol *local_1f8;
  bitmask<slang::ast::LookupFlags> local_1ec;
  SourceRange local_1e8;
  Scope *local_1d8;
  undefined8 local_1d0;
  string_view local_1c8;
  SourceLocation local_1b8;
  bitmask<slang::ast::AssignFlags> local_1a9;
  SourceLocation local_1a8;
  bitmask<slang::ast::ASTFlags> local_1a0;
  ASTContext *in_stack_fffffffffffffe70;
  Expression *in_stack_fffffffffffffe78;
  bitmask<slang::ast::AssignFlags> flags;
  SourceLocation SVar8;
  Token local_160;
  AttributeSpecSyntax *local_150;
  const_iterator local_148;
  const_iterator local_138;
  long local_128;
  bitmask<slang::ast::ASTFlags> local_120;
  undefined1 local_118 [56];
  EdgeKind local_e0;
  undefined4 uStack_dc;
  TimingControl *local_d8;
  EdgeKind local_d0;
  undefined4 uStack_cc;
  TimingControl *local_c8;
  ClockingSkew local_c0;
  ClockingSkew local_b0;
  int local_9c;
  bitmask<slang::ast::ASTFlags> local_98;
  Scope *local_90;
  undefined8 local_88;
  sockaddr local_80 [3];
  Scope *local_48;
  uint32_t local_40;
  Scope *local_38;
  uint32_t local_30;
  undefined4 uStack_2c;
  Scope *local_28;
  Compilation *local_20;
  long local_10;
  Scope *local_8;
  Expression *longestStaticPrefix;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = Scope::getCompilation(in_RDI);
  this = Scope::asSymbol(local_8);
  local_28 = Symbol::getParentScope(this);
  Scope::asSymbol(local_8);
  LVar5 = LookupLocation::before((Symbol *)in_stack_fffffffffffffd10);
  local_90 = LVar5.scope;
  local_40 = LVar5.index;
  local_88 = CONCAT44(uStack_2c,local_40);
  args_1 = local_28;
  local_48 = local_90;
  local_38 = local_90;
  local_30 = local_40;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_98,NonProcedural);
  LVar5._8_8_ = in_stack_fffffffffffffd30;
  LVar5.scope = in_stack_fffffffffffffd28;
  ASTContext::ASTContext
            ((ASTContext *)in_stack_fffffffffffffd18,(Scope *)in_stack_fffffffffffffd10,LVar5,
             in_stack_fffffffffffffd20);
  local_9c = 0;
  ClockingSkew::ClockingSkew(&local_b0);
  ClockingSkew::ClockingSkew(&local_c0);
  pCVar3 = not_null<slang::syntax::ClockingDirectionSyntax_*>::operator->
                     ((not_null<slang::syntax::ClockingDirectionSyntax_*> *)0x10cb293);
  if ((pCVar3->input).kind == InOutKeyword) {
    local_9c = 2;
  }
  else {
    not_null<slang::syntax::ClockingDirectionSyntax_*>::operator->
              ((not_null<slang::syntax::ClockingDirectionSyntax_*> *)0x10cb2bc);
    bVar1 = parsing::Token::operator_cast_to_bool((Token *)0x10cb2c8);
    if ((bVar1) &&
       (pCVar3 = not_null<slang::syntax::ClockingDirectionSyntax_*>::operator->
                           ((not_null<slang::syntax::ClockingDirectionSyntax_*> *)0x10cb2df),
       pCVar3->inputSkew != (ClockingSkewSyntax *)0x0)) {
      not_null<slang::syntax::ClockingDirectionSyntax_*>::operator->
                ((not_null<slang::syntax::ClockingDirectionSyntax_*> *)0x10cb2f7);
      CVar6 = ClockingSkew::fromSyntax
                        (in_stack_fffffffffffffd90,(ASTContext *)in_stack_fffffffffffffd88.ptr);
      local_c8 = CVar6.delay;
      local_d0 = CVar6.edge;
      local_b0._4_4_ = uStack_cc;
      local_b0.edge = local_d0;
      local_b0.delay = local_c8;
    }
    not_null<slang::syntax::ClockingDirectionSyntax_*>::operator->
              ((not_null<slang::syntax::ClockingDirectionSyntax_*> *)0x10cb34a);
    bVar1 = parsing::Token::operator_cast_to_bool((Token *)0x10cb356);
    if (bVar1) {
      not_null<slang::syntax::ClockingDirectionSyntax_*>::operator->
                ((not_null<slang::syntax::ClockingDirectionSyntax_*> *)0x10cb370);
      bVar1 = parsing::Token::operator_cast_to_bool((Token *)0x10cb37c);
      local_9c = 1;
      if (bVar1) {
        local_9c = 2;
      }
      pCVar3 = not_null<slang::syntax::ClockingDirectionSyntax_*>::operator->
                         ((not_null<slang::syntax::ClockingDirectionSyntax_*> *)0x10cb3a6);
      if (pCVar3->outputSkew != (ClockingSkewSyntax *)0x0) {
        not_null<slang::syntax::ClockingDirectionSyntax_*>::operator->
                  ((not_null<slang::syntax::ClockingDirectionSyntax_*> *)0x10cb3be);
        CVar6 = ClockingSkew::fromSyntax
                          (in_stack_fffffffffffffd90,(ASTContext *)in_stack_fffffffffffffd88.ptr);
        local_d8 = CVar6.delay;
        local_e0 = CVar6.edge;
        local_c0._4_4_ = uStack_dc;
        local_c0.edge = local_e0;
        local_c0.delay = local_d8;
      }
    }
  }
  if ((local_9c == 1) || (local_9c == 2)) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_120,LValue);
    ASTContext::resetFlags((ASTContext *)in_stack_fffffffffffffd18,in_stack_fffffffffffffd20);
    memcpy(local_80,local_118,0x38);
  }
  local_128 = local_10 + 0x58;
  local_138 = slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::begin
                        ((SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *)0x10cb480);
  local_148 = slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::end
                        ((SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *)0x10cb49d);
  while (bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::iterator_base<const_slang::syntax::AttributeSpecSyntax_*>_>
                           ((self_type *)in_stack_fffffffffffffd10,
                            (iterator_base<const_slang::syntax::AttributeSpecSyntax_*> *)
                            in_stack_fffffffffffffd08), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_150 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::iterator_base<const_slang::syntax::AttributeSpecSyntax_*>,_false>
                ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::iterator_base<const_slang::syntax::AttributeSpecSyntax_*>,_false>
                             *)0x10cb4da);
    local_160.kind = (local_150->name).kind;
    local_160._2_1_ = (local_150->name).field_0x2;
    local_160.numFlags.raw = (local_150->name).numFlags.raw;
    local_160.rawLen = (local_150->name).rawLen;
    local_160.info = (local_150->name).info;
    args_4 = local_20;
    sVar7 = parsing::Token::valueText((Token *)in_stack_fffffffffffffd20.m_bits);
    SVar8 = (SourceLocation)sVar7._M_len;
    SVar4 = parsing::Token::location(&local_160);
    flags.m_bits = SVar4._7_1_;
    this_00 = BumpAllocator::
              emplace<slang::ast::ClockVarSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::ArgumentDirection&,slang::ast::ClockingSkew&,slang::ast::ClockingSkew&>
                        ((BumpAllocator *)in_stack_fffffffffffffd90,
                         (basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffffd88.ptr,(SourceLocation *)args_1,
                         (ArgumentDirection *)in_stack_fffffffffffffd78,
                         (ClockingSkew *)in_stack_fffffffffffffd70,(ClockingSkew *)args_4);
    Symbol::setSyntax((Symbol *)this_00,&local_150->super_SyntaxNode);
    in_stack_fffffffffffffd70 = this_00;
    in_stack_fffffffffffffd78 = local_28;
    std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
    span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
              ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
               in_stack_fffffffffffffd20.m_bits,
               (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffd18);
    syntax_00._M_extent._M_extent_value._0_7_ = in_stack_fffffffffffffd50;
    syntax_00._M_ptr = (pointer)in_stack_fffffffffffffd48;
    syntax_00._M_extent._M_extent_value._7_1_ = in_stack_fffffffffffffd57.m_bits;
    Symbol::setAttributes
              (&in_stack_fffffffffffffd40->super_Symbol,(Scope *)in_stack_fffffffffffffd38,syntax_00
              );
    SmallVectorBase<const_slang::ast::ClockVarSymbol_*>::push_back
              ((SmallVectorBase<const_slang::ast::ClockVarSymbol_*> *)in_stack_fffffffffffffd10,
               (ClockVarSymbol **)in_stack_fffffffffffffd08);
    if (local_150->value == (EqualsValueClauseSyntax *)0x0) {
      in_stack_fffffffffffffd48 = local_28;
      local_1c8 = parsing::Token::valueText((Token *)in_stack_fffffffffffffd20.m_bits);
      local_1d8 = local_38;
      local_1d0 = CONCAT44(uStack_2c,local_30);
      local_1e8 = parsing::Token::range((Token *)in_stack_fffffffffffffd30);
      bitmask<slang::ast::LookupFlags>::bitmask(&local_1ec,None);
      in_stack_fffffffffffffd08 = local_1e8.startLoc;
      in_stack_fffffffffffffd10 = local_1e8.endLoc;
      local_1b8 = (SourceLocation)
                  Lookup::unqualifiedAt
                            (in_stack_00000058,(string_view)in_stack_00000078,
                             (LookupLocation)in_stack_00000068,(SourceRange)in_stack_000000a0,
                             in_stack_00000064);
      if (((local_1b8 != (SourceLocation)0x0) && (*(int *)local_1b8 != 0x3b)) &&
         (*(int *)local_1b8 != 0x3c)) {
        local_1fc = 0x550006;
        local_210 = parsing::Token::range((Token *)in_stack_fffffffffffffd30);
        sourceRange.endLoc = in_stack_fffffffffffffd38;
        sourceRange.startLoc = in_stack_fffffffffffffd30;
        in_stack_fffffffffffffd40 =
             (ValueSymbol *)
             ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffd28,
                                 SUB84((ulong)in_stack_fffffffffffffd40 >> 0x20,0),sourceRange);
        local_1f8 = in_stack_fffffffffffffd40;
        local_220 = parsing::Token::valueText((Token *)in_stack_fffffffffffffd20.m_bits);
        sVar7._M_str = (char *)in_stack_fffffffffffffd60;
        sVar7._M_len = (size_t)in_stack_fffffffffffffd58;
        Diagnostic::operator<<
                  ((Diagnostic *)
                   CONCAT17(in_stack_fffffffffffffd57.m_bits,in_stack_fffffffffffffd50),sVar7);
        local_224 = 0x50001;
        local_230 = *(undefined8 *)((long)local_1b8 + 0x18);
        Diagnostic::addNote((Diagnostic *)in_stack_fffffffffffffd10,
                            SUB84(in_stack_fffffffffffffd20.m_bits >> 0x20,0),
                            in_stack_fffffffffffffd18);
        local_1b8 = (SourceLocation)0x0;
      }
      if (local_1b8 == (SourceLocation)0x0) {
        in_stack_fffffffffffffd88 =
             ValueSymbol::getDeclaredType((ValueSymbol *)in_stack_fffffffffffffd08);
        in_stack_fffffffffffffd18 =
             (SourceLocation)
             not_null<slang::ast::DeclaredType_*>::operator->
                       ((not_null<slang::ast::DeclaredType_*> *)0x10cba68);
        newType = Compilation::getErrorType(local_20);
        DeclaredType::setType((DeclaredType *)in_stack_fffffffffffffd18,newType);
        this_00 = in_stack_fffffffffffffd60;
      }
      else {
        local_238 = Symbol::getDeclaredType((Symbol *)in_stack_fffffffffffffd18);
        local_240 = (DeclaredType *)
                    ValueSymbol::getDeclaredType((ValueSymbol *)in_stack_fffffffffffffd08);
        this_01 = not_null<slang::ast::DeclaredType_*>::operator->
                            ((not_null<slang::ast::DeclaredType_*> *)0x10cb92d);
        DeclaredType::setLink(this_01,local_238);
        SVar8 = (this_00->super_VariableSymbol).super_ValueSymbol.super_Symbol.location;
        in_stack_fffffffffffffd30 =
             (SourceLocation)
             &(this_00->super_VariableSymbol).super_ValueSymbol.super_Symbol.location;
        in_stack_fffffffffffffd38 = local_1b8;
        std::basic_string_view<char,_std::char_traits<char>_>::length
                  (&(this_00->super_VariableSymbol).super_ValueSymbol.super_Symbol.name);
        SVar4 = SourceLocation::operator+<unsigned_long>
                          ((SourceLocation *)in_stack_fffffffffffffd18,
                           (unsigned_long)in_stack_fffffffffffffd10);
        SourceRange::SourceRange(&local_258,SVar8,SVar4);
        in_stack_fffffffffffffd08 =
             (SourceLocation)((ulong)in_stack_fffffffffffffd08 & 0xffffffff00000000);
        local_248 = (Scope *)ValueExpressionBase::fromSymbol
                                       (in_stack_00000108,(Symbol *)diag,in_stack_000000f8,
                                        in_stack_00000110,in_stack_000000f7,in_stack_000000f6);
        this_00 = in_stack_fffffffffffffd60;
        if (local_9c != 0) {
          in_stack_fffffffffffffd20.m_bits =
               (underlying_type)Symbol::as<slang::ast::ValueSymbol>((Symbol *)0x10cba01);
          in_stack_fffffffffffffd28 = local_248;
          bitmask<slang::ast::AssignFlags>::bitmask
                    ((bitmask<slang::ast::AssignFlags> *)&stack0xfffffffffffffd97,ClockVar);
          ASTContext::addDriver
                    ((ASTContext *)in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
                     (Expression *)in_stack_fffffffffffffd38,in_stack_fffffffffffffd57);
          this_00 = in_stack_fffffffffffffd60;
        }
      }
    }
    else {
      in_stack_fffffffffffffd58 =
           not_null<slang::syntax::ExpressionSyntax_*>::operator*
                     ((not_null<slang::syntax::ExpressionSyntax_*> *)0x10cb61f);
      bitmask<slang::ast::ASTFlags>::bitmask(&local_1a0,None);
      iVar2 = Expression::bind((int)in_stack_fffffffffffffd58,local_80,(socklen_t)local_1a0.m_bits);
      longestStaticPrefix = (Expression *)CONCAT44(extraout_var,iVar2);
      not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x10cb675)
      ;
      ValueSymbol::setType
                ((ValueSymbol *)in_stack_fffffffffffffd10,(Type *)in_stack_fffffffffffffd08);
      ValueSymbol::setInitializer
                ((ValueSymbol *)in_stack_fffffffffffffd10,(Expression *)in_stack_fffffffffffffd08);
      if (local_9c != 0) {
        in_stack_fffffffffffffd50 = SUB87(longestStaticPrefix,0);
        in_stack_fffffffffffffd57.m_bits = (underlying_type)((ulong)longestStaticPrefix >> 0x38);
        local_1a8 = parsing::Token::location(&local_150->value->equals);
        bitmask<slang::ast::AssignFlags>::bitmask(&local_1a9,ClockVar);
        Expression::requireLValue
                  (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,SVar8,flags,
                   longestStaticPrefix);
      }
    }
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::iterator_base<const_slang::syntax::AttributeSpecSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::iterator_base<const_slang::syntax::AttributeSpecSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::iterator_base<const_slang::syntax::AttributeSpecSyntax_*>,_false>
                *)in_stack_fffffffffffffd10);
    in_stack_fffffffffffffd60 = this_00;
  }
  return;
}

Assistant:

void ClockVarSymbol::fromSyntax(const Scope& scope, const ClockingItemSyntax& syntax,
                                SmallVectorBase<const ClockVarSymbol*>& results) {
    // Lookups should happen in the parent of the clocking block, since other
    // clocking block members cannot reference each other.
    auto& comp = scope.getCompilation();
    auto parent = scope.asSymbol().getParentScope();
    SLANG_ASSERT(parent);

    LookupLocation ll = LookupLocation::before(scope.asSymbol());
    ASTContext context(*parent, ll, ASTFlags::NonProcedural);

    ArgumentDirection dir = ArgumentDirection::In;
    ClockingSkew inputSkew, outputSkew;
    if (syntax.direction->input.kind == TokenKind::InOutKeyword) {
        dir = ArgumentDirection::InOut;
    }
    else {
        if (syntax.direction->input) {
            if (syntax.direction->inputSkew)
                inputSkew = ClockingSkew::fromSyntax(*syntax.direction->inputSkew, context);
        }

        if (syntax.direction->output) {
            dir = syntax.direction->input ? ArgumentDirection::InOut : ArgumentDirection::Out;
            if (syntax.direction->outputSkew)
                outputSkew = ClockingSkew::fromSyntax(*syntax.direction->outputSkew, context);
        }
    }

    if (dir == ArgumentDirection::Out || dir == ArgumentDirection::InOut)
        context = context.resetFlags(ASTFlags::LValue);

    for (auto decl : syntax.decls) {
        auto name = decl->name;
        auto arg = comp.emplace<ClockVarSymbol>(name.valueText(), name.location(), dir, inputSkew,
                                                outputSkew);
        arg->setSyntax(*decl);
        arg->setAttributes(*parent, syntax.attributes);
        results.push_back(arg);

        // If there is an initializer expression we take our type from that.
        // Otherwise we need to lookup the signal in our parent scope and
        // take the type from that.
        if (decl->value) {
            auto& expr = Expression::bind(*decl->value->expr, context);
            arg->setType(*expr.type);
            arg->setInitializer(expr);

            if (dir != ArgumentDirection::In)
                expr.requireLValue(context, decl->value->equals.location(), AssignFlags::ClockVar);
        }
        else {
            auto sym = Lookup::unqualifiedAt(*parent, name.valueText(), ll, name.range());
            if (sym && sym->kind != SymbolKind::Net && sym->kind != SymbolKind::Variable) {
                auto& diag = context.addDiag(diag::InvalidClockingSignal, name.range());
                diag << name.valueText();
                diag.addNote(diag::NoteDeclarationHere, sym->location);
                sym = nullptr;
            }

            if (sym) {
                auto sourceType = sym->getDeclaredType();
                SLANG_ASSERT(sourceType);
                arg->getDeclaredType()->setLink(*sourceType);

                auto& valExpr = ValueExpressionBase::fromSymbol(
                    context, *sym, nullptr, {arg->location, arg->location + arg->name.length()});

                if (dir != ArgumentDirection::In)
                    context.addDriver(sym->as<ValueSymbol>(), valExpr, AssignFlags::ClockVar);
            }
            else {
                arg->getDeclaredType()->setType(comp.getErrorType());
            }
        }
    }
}